

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

void ssh1mainchan_start_shell(SshChannel *sc,_Bool want_reply)

{
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_connection_state *s;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)sc[0xd].cl,0xc);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,&pPVar1->qnode);
  ssh1mainchan_queue_response((ssh1_connection_state *)(sc + -2),want_reply,true);
  return;
}

Assistant:

static void ssh1mainchan_start_shell(SshChannel *sc, bool want_reply)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_EXEC_SHELL);
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, true);
}